

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphElements.h
# Opt level: O0

bool __thiscall
dg::vr::VRCodeGraph::DFSIt<dg::vr::VRCodeGraph::SimpleVisit>::inOtherFunction
          (DFSIt<dg::vr::VRCodeGraph::SimpleVisit> *this,VREdge *edge)

{
  bool bVar1;
  pointer this_00;
  VRInstruction *this_01;
  long lVar2;
  long in_RDI;
  Instruction *inst;
  
  this_00 = std::unique_ptr<dg::vr::VROp,_std::default_delete<dg::vr::VROp>_>::operator->
                      ((unique_ptr<dg::vr::VROp,_std::default_delete<dg::vr::VROp>_> *)0x1f8345);
  bVar1 = VROp::isInstruction(this_00);
  if (bVar1) {
    this_01 = (VRInstruction *)
              std::unique_ptr<dg::vr::VROp,_std::default_delete<dg::vr::VROp>_>::get
                        ((unique_ptr<dg::vr::VROp,_std::default_delete<dg::vr::VROp>_> *)0x1f8361);
    VRInstruction::getInstruction(this_01);
    lVar2 = llvm::Instruction::getFunction();
    if (lVar2 != *(long *)(in_RDI + 0x30)) {
      return true;
    }
  }
  return false;
}

Assistant:

bool inOtherFunction(VREdge *edge) const {
            if (edge->op->isInstruction()) {
                const llvm::Instruction *inst =
                        static_cast<VRInstruction *>(edge->op.get())
                                ->getInstruction();
                if (inst->getFunction() != function) {
                    assert(0 && "has edge to other function");
                    return true;
                }
            }
            return false;
        }